

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::got::got(got *this,location *where_,text *expr_,text *excpt_)

{
  allocator<char> local_c1;
  text local_c0;
  text local_a0;
  location local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  text *local_28;
  text *excpt__local;
  text *expr__local;
  location *where__local;
  got *this_local;
  
  local_28 = excpt_;
  excpt__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::operator+(&local_48,"passed: got exception ",excpt_);
  location::location(&local_70,where_);
  std::__cxx11::string::string((string *)&local_a0,(string *)expr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  success::success(&this->super_success,&local_48,&local_70,&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  location::~location(&local_70);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_success).super_message = &PTR__got_00170ce8;
  return;
}

Assistant:

got( location where_, text expr_, text excpt_)
    : success( "passed: got exception " + excpt_, where_, expr_) {}